

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O0

bool __thiscall
Fossilize::FeatureFilter::Impl::render_pass_is_supported(Impl *this,VkRenderPassCreateInfo *info)

{
  size_type sVar1;
  bool bVar2;
  uint local_68;
  uint local_64;
  uint32_t i_2;
  uint32_t i_1;
  uint32_t k_1;
  uint32_t k;
  uint32_t j;
  VkFormatFeatureFlags format_features;
  uint32_t i;
  undefined4 local_24;
  VkRenderPassCreateInfo *pVStack_20;
  VkRenderPassCreateFlags supported_flags;
  VkRenderPassCreateInfo *info_local;
  Impl *this_local;
  
  local_24 = 2;
  if ((info->flags & 0xfffffffd) == 0) {
    format_features._2_1_ = 0;
    format_features._1_1_ = 0;
    bVar2 = false;
    pVStack_20 = info;
    info_local = (VkRenderPassCreateInfo *)this;
    if ((info->flags & 2) != 0) {
      std::allocator<char>::allocator();
      format_features._2_1_ = 1;
      std::__cxx11::string::string
                ((string *)&i,"VK_QCOM_render_pass_transform",
                 (allocator *)((long)&format_features + 3));
      format_features._1_1_ = 1;
      sVar1 = std::
              unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(&this->enabled_extensions,(key_type *)&i);
      bVar2 = sVar1 == 0;
    }
    if ((format_features._1_1_ & 1) != 0) {
      std::__cxx11::string::~string((string *)&i);
    }
    if ((format_features._2_1_ & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)((long)&format_features + 3));
    }
    if (bVar2) {
      this_local._7_1_ = false;
    }
    else if ((this->null_device & 1U) == 0) {
      bVar2 = pnext_chain_is_supported(this,pVStack_20->pNext);
      if (bVar2) {
        for (j = 0; j < pVStack_20->attachmentCount; j = j + 1) {
          k = 0;
          for (k_1 = 0; k_1 < pVStack_20->subpassCount; k_1 = k_1 + 1) {
            for (i_1 = 0; i_1 < pVStack_20->pSubpasses[k_1].colorAttachmentCount; i_1 = i_1 + 1) {
              if (pVStack_20->pSubpasses[k_1].pColorAttachments[i_1].attachment == j) {
                k = k | 0x80;
              }
              if ((pVStack_20->pSubpasses[k_1].pResolveAttachments != (VkAttachmentReference *)0x0)
                 && (pVStack_20->pSubpasses[k_1].pResolveAttachments[i_1].attachment == j)) {
                k = k | 0x80;
              }
            }
            for (i_2 = 0; i_2 < pVStack_20->pSubpasses[k_1].inputAttachmentCount; i_2 = i_2 + 1) {
              if (pVStack_20->pSubpasses[k_1].pInputAttachments[i_2].attachment == j) {
                k = k | 1;
              }
            }
            if ((pVStack_20->pSubpasses[k_1].pDepthStencilAttachment != (VkAttachmentReference *)0x0
                ) && ((pVStack_20->pSubpasses[k_1].pDepthStencilAttachment)->attachment == j)) {
              k = k | 0x200;
            }
          }
          bVar2 = attachment_description_is_supported(this,pVStack_20->pAttachments + j,k);
          if (!bVar2) {
            return false;
          }
        }
        for (local_64 = 0; local_64 < pVStack_20->subpassCount; local_64 = local_64 + 1) {
          bVar2 = subpass_description_is_supported(this,pVStack_20->pSubpasses + local_64);
          if (!bVar2) {
            return false;
          }
        }
        for (local_68 = 0; local_68 < pVStack_20->dependencyCount; local_68 = local_68 + 1) {
          bVar2 = subpass_dependency_is_supported(this,pVStack_20->pDependencies + local_68);
          if (!bVar2) {
            return false;
          }
        }
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool FeatureFilter::Impl::render_pass_is_supported(const VkRenderPassCreateInfo *info) const
{
	// Only allow flags we recognize and validate.
	constexpr VkRenderPassCreateFlags supported_flags = VK_RENDER_PASS_CREATE_TRANSFORM_BIT_QCOM;
	if ((info->flags & ~supported_flags) != 0)
		return false;

	if ((info->flags & VK_RENDER_PASS_CREATE_TRANSFORM_BIT_QCOM) != 0 &&
	    enabled_extensions.count(VK_QCOM_RENDER_PASS_TRANSFORM_EXTENSION_NAME) == 0)
		return false;

	if (null_device)
		return true;

	if (!pnext_chain_is_supported(info->pNext))
		return false;

	for (uint32_t i = 0; i < info->attachmentCount; i++)
	{
		VkFormatFeatureFlags format_features = 0;

		for (uint32_t j = 0; j < info->subpassCount; j++)
		{
			for (uint32_t k = 0; k < info->pSubpasses[j].colorAttachmentCount; k++)
			{
				if (info->pSubpasses[j].pColorAttachments[k].attachment == i)
					format_features |= VK_FORMAT_FEATURE_COLOR_ATTACHMENT_BIT;

				if (info->pSubpasses[j].pResolveAttachments &&
				    info->pSubpasses[j].pResolveAttachments[k].attachment == i)
				{
					format_features |= VK_FORMAT_FEATURE_COLOR_ATTACHMENT_BIT;
				}
			}

			for (uint32_t k = 0; k < info->pSubpasses[j].inputAttachmentCount; k++)
				if (info->pSubpasses[j].pInputAttachments[k].attachment == i)
					format_features |= VK_FORMAT_FEATURE_SAMPLED_IMAGE_BIT;

			if (info->pSubpasses[j].pDepthStencilAttachment &&
			    info->pSubpasses[j].pDepthStencilAttachment->attachment == i)
			{
				format_features |= VK_FORMAT_FEATURE_DEPTH_STENCIL_ATTACHMENT_BIT;
			}
		}

		if (!attachment_description_is_supported(info->pAttachments[i], format_features))
			return false;
	}

	for (uint32_t i = 0; i < info->subpassCount; i++)
	{
		if (!subpass_description_is_supported(info->pSubpasses[i]))
			return false;
	}

	for (uint32_t i = 0; i < info->dependencyCount; i++)
	{
		if (!subpass_dependency_is_supported(info->pDependencies[i]))
			return false;
	}

	return true;
}